

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

double ON_Length2d(double x,double y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = ABS(x);
  dVar2 = ABS(y);
  dVar3 = dVar2;
  if (dVar2 <= dVar1) {
    dVar3 = dVar1;
  }
  if (dVar3 <= 2.2250738585072014e-308) {
    if (dVar3 <= 0.0) {
      dVar3 = 0.0;
    }
  }
  else {
    if (dVar2 <= dVar1) {
      dVar1 = dVar2;
    }
    dVar1 = (dVar1 / dVar3) * (dVar1 / dVar3) + 1.0;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    dVar3 = dVar3 * dVar1;
  }
  return dVar3;
}

Assistant:

double ON_Length2d( double x, double y )
{
  double len;
  x = fabs(x);
  y = fabs(y);
  if ( y > x ) {
    len = x; x = y; y = len;
  }
 
  // 15 September 2003 Dale Lear
  //     For small denormalized doubles (positive but smaller
  //     than DBL_MIN), some compilers/FPUs set 1.0/fx to +INF.
  //     Without the ON_DBL_MIN test we end up with
  //     microscopic vectors that have infinite length!
  //
  //     This code is absolutely necessary.  It is a critical
  //     part of the bug fix for RR 11217.
  if ( x > ON_DBL_MIN )
  {
    y /= x;
    len = x*sqrt(1.0 + y*y);
  }
  else if ( x > 0.0 && ON_IS_FINITE(x) )
    len = x;
  else
    len = 0.0;

  return len;
}